

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void load_balancing(void)

{
  ostream *poVar1;
  int *piVar2;
  size_type sVar3;
  double dVar4;
  double normalized_imbalance;
  vector<int,_std::allocator<int>_> optimal_partition;
  vector<int,_std::allocator<int>_> new_partition;
  double initial_imbalance;
  vector<double,_std::allocator<double>_> global_weights;
  bool need_to_balance;
  int in_stack_00000180;
  int in_stack_00000184;
  vector<double,_std::allocator<double>_> *in_stack_00000188;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff18;
  ostream *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff40;
  int iVar5;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff48;
  vector<int,_std::allocator<int>_> *partition;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  undefined1 local_88 [4];
  int in_stack_ffffffffffffff7c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff80;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  vector<int,_std::allocator<int>_> local_50;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  double local_28;
  byte local_1;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  local_1 = 0;
  calculate_global_layer_weights();
  if (mpi_rank == 0) {
    local_28 = calculate_partition_imbalance
                         (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,iVar5);
    local_1 = balancing_threshold < local_28;
  }
  MPI_Bcast(&local_1,1,&ompi_mpi_cxx_bool,0,&ompi_mpi_comm_world);
  if ((local_1 & 1) != 0) {
    std::allocator<int>::allocator((allocator<int> *)0x14bf9e);
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (allocator_type *)in_stack_ffffffffffffff20);
    std::allocator<int>::~allocator((allocator<int> *)0x14bfc4);
    if (mpi_rank == 0) {
      calculate_optimal_partition(in_stack_00000188,in_stack_00000184,in_stack_00000180);
      normalize_new_partition
                (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      partition = &local_50;
      iVar5 = (int)((ulong)local_88 >> 0x20);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff18);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20);
      dVar4 = calculate_partition_imbalance(in_stack_ffffffffffffff50,partition,iVar5);
      poVar1 = std::operator<<((ostream *)&std::cout,"Load balancing: imbalance ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28);
      poVar1 = std::operator<<(poVar1,", after balancing ");
      in_stack_ffffffffffffff20 = (ostream *)std::ostream::operator<<(poVar1,dVar4);
      std::ostream::operator<<(in_stack_ffffffffffffff20,std::endl<char,std::char_traits<char>>);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20);
    }
    piVar2 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x14c160);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_50);
    MPI_Bcast(piVar2,sVar3 & 0xffffffff,&ompi_mpi_int,0,&ompi_mpi_comm_world);
    resize_regions(in_stack_ffffffffffffffd0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20);
  return;
}

Assistant:

void load_balancing() {
    bool need_to_balance = false;
    
    auto global_weights = calculate_global_layer_weights();
    
    double initial_imbalance;
    if (mpi_rank == 0) {
        initial_imbalance = calculate_partition_imbalance(global_weights, x0_sr, nx_ich);

        need_to_balance = (initial_imbalance > balancing_threshold);
    }

    MPI_Bcast(&need_to_balance, 1, MPI_CXX_BOOL, 0, MPI_COMM_WORLD);

    if (need_to_balance) {
        std::vector<int> new_partition(n_sr);

        if (mpi_rank == 0) {
            auto optimal_partition = calculate_optimal_partition(global_weights, n_sr, nx_ich);
            new_partition = normalize_new_partition(x0_sr, optimal_partition, nx_ich);
            auto normalized_imbalance = calculate_partition_imbalance(global_weights, new_partition, nx_ich);

            cout << "Load balancing: imbalance " << initial_imbalance << ", after balancing " << normalized_imbalance << endl;
        }

        MPI_Bcast(new_partition.data(), new_partition.size(), MPI_INT, 0, MPI_COMM_WORLD);

        resize_regions(new_partition);
    }
}